

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

int64 __thiscall IR::Opnd::GetImmediateValue(Opnd *this,Func *func)

{
  ThreadContextInfo *context;
  code *pcVar1;
  bool bVar2;
  HelperCallOpnd *opnd;
  intptr_t iVar3;
  IntConstOpnd *pIVar4;
  AddrOpnd *pAVar5;
  undefined4 *puVar6;
  
  switch(this->m_kind) {
  case OpndKindIntConst:
    pIVar4 = AsIntConstOpnd(this);
    break;
  case OpndKindInt64Const:
    pIVar4 = (IntConstOpnd *)AsInt64ConstOpnd(this);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x1d3,"((0))","Unexpected immediate opnd kind");
    if (bVar2) {
      *puVar6 = 0;
      return 0;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case OpndKindHelperCall:
    context = func->m_threadContextInfo;
    opnd = AsHelperCallOpnd(this);
    iVar3 = GetMethodAddress(context,opnd);
    return iVar3;
  case OpndKindAddr:
    pAVar5 = AsAddrOpnd(this);
    return (int64)pAVar5->m_address;
  }
  return (pIVar4->super_EncodableOpnd<long>).m_value;
}

Assistant:

int64
Opnd::GetImmediateValue(Func* func)
{
    switch (this->GetKind())
    {
    case OpndKindIntConst:
        return this->AsIntConstOpnd()->GetValue();

    case OpndKindInt64Const:
        return this->AsInt64ConstOpnd()->GetValue();

    case OpndKindAddr:
        return (intptr_t)this->AsAddrOpnd()->m_address;

    case OpndKindHelperCall:
        return (intptr_t)IR::GetMethodAddress(func->GetThreadContextInfo(), this->AsHelperCallOpnd());

    default:
        AssertMsg(UNREACHED, "Unexpected immediate opnd kind");
        return 0;
    }
}